

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial_test.hpp
# Opt level: O3

void TestKLPConstructorCimod<unsigned_long,double>
               (Polynomial<unsigned_long,_double> *polynomial,string *type)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  runtime_error *this;
  size_t __i;
  long lVar4;
  Binaries init_spins;
  KLocalPolynomial<openjij::graph::Polynomial<double>_> system;
  BinaryPolynomialModel<unsigned_long,_double> bpm_cimod;
  mt19937 mt;
  random_device rnd;
  Binaries local_2a90;
  Binaries local_2a78;
  undefined1 local_2a60 [16];
  undefined8 uStack_2a50;
  undefined8 local_2a48;
  void *pvStack_2a40;
  undefined8 local_2a38;
  long lStack_2a30;
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_2a28;
  undefined1 local_29f0 [8];
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_29e8;
  pointer piStack_29d0;
  pointer local_29c8;
  long lStack_29c0;
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_29b8 [6];
  BinaryPolynomialModel<unsigned_long,_double> local_2860;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2728;
  random_device local_13a0;
  
  cimod::BinaryPolynomialModel<unsigned_long,_double>::BinaryPolynomialModel
            (&local_2860,polynomial,BINARY);
  std::random_device::random_device(&local_13a0);
  uVar1 = std::random_device::_M_getval();
  local_2728._M_x[0] = (unsigned_long)uVar1;
  lVar4 = 1;
  uVar3 = local_2728._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
    local_2728._M_x[lVar4] = uVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_2728._M_p = 0x270;
  local_29b8[0]._M_buckets = &local_29b8[0]._M_single_bucket;
  local_29f0 = (undefined1  [8])0x3;
  local_29e8.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_29e8.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_29e8.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piStack_29d0 = (pointer)0x0;
  local_29c8 = (pointer)0x0;
  lStack_29c0 = 0;
  local_29b8[0]._M_bucket_count = 1;
  local_29b8[0]._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_29b8[0]._M_element_count = 0;
  local_29b8[0]._M_rehash_policy._M_max_load_factor = 1.0;
  local_29b8[0]._M_rehash_policy._M_next_resize = 0;
  local_29b8[0]._M_single_bucket = (__node_base_ptr)0x0;
  openjij::graph::Graph::
  gen_binary<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (&local_2a78,(Graph *)local_29f0,&local_2728);
  std::
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_29b8);
  if (piStack_29d0 != (pointer)0x0) {
    operator_delete(piStack_29d0,lStack_29c0 - (long)piStack_29d0);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_29e8);
  cimod::BinaryPolynomialModel<unsigned_long,double>::ToSerializable_abi_cxx11_
            ((BinaryPolynomialModel<unsigned_long,double> *)local_2a60);
  openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::KLocalPolynomial
            ((KLocalPolynomial<openjij::graph::Polynomial<double>_> *)local_29f0,&local_2a78,
             (json *)local_2a60);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_2a60);
  iVar2 = std::__cxx11::string::compare((char *)type);
  if (iVar2 == 0) {
    TestKLPSystemDense<double>((KLocalPolynomial<openjij::graph::Polynomial<double>_> *)local_29f0);
    local_2a28._M_buckets = &local_2a28._M_single_bucket;
    local_2a60._0_8_ = 3;
    local_2a60._8_8_ = (object_t *)0x0;
    uStack_2a50 = 0;
    local_2a48 = 0;
    pvStack_2a40 = (void *)0x0;
    local_2a38 = 0;
    lStack_2a30 = 0;
    local_2a28._M_bucket_count = 1;
    local_2a28._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2a28._M_element_count = 0;
    local_2a28._M_rehash_policy._M_max_load_factor = 1.0;
    local_2a28._M_rehash_policy._M_next_resize = 0;
    local_2a28._M_single_bucket = (__node_base_ptr)0x0;
    openjij::graph::Graph::
    gen_binary<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              (&local_2a90,(Graph *)local_2a60,&local_2728);
    openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::reset_binaries
              ((KLocalPolynomial<openjij::graph::Polynomial<double>_> *)local_29f0,&local_2a90);
    if (local_2a90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2a90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_2a28);
    if (pvStack_2a40 != (void *)0x0) {
      operator_delete(pvStack_2a40,lStack_2a30 - (long)pvStack_2a40);
    }
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)(local_2a60 + 8));
    TestKLPSystemDense<double>((KLocalPolynomial<openjij::graph::Polynomial<double>_> *)local_29f0);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)type);
    if (iVar2 != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unknown type");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    TestKLPSystemSparse<double>((KLocalPolynomial<openjij::graph::Polynomial<double>_> *)local_29f0)
    ;
    local_2a28._M_buckets = &local_2a28._M_single_bucket;
    local_2a60._0_8_ = 3;
    local_2a60._8_8_ = (object_t *)0x0;
    uStack_2a50 = 0;
    local_2a48 = 0;
    pvStack_2a40 = (void *)0x0;
    local_2a38 = 0;
    lStack_2a30 = 0;
    local_2a28._M_bucket_count = 1;
    local_2a28._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2a28._M_element_count = 0;
    local_2a28._M_rehash_policy._M_max_load_factor = 1.0;
    local_2a28._M_rehash_policy._M_next_resize = 0;
    local_2a28._M_single_bucket = (__node_base_ptr)0x0;
    openjij::graph::Graph::
    gen_binary<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              (&local_2a90,(Graph *)local_2a60,&local_2728);
    openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::reset_binaries
              ((KLocalPolynomial<openjij::graph::Polynomial<double>_> *)local_29f0,&local_2a90);
    if (local_2a90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2a90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_2a28);
    if (pvStack_2a40 != (void *)0x0) {
      operator_delete(pvStack_2a40,lStack_2a30 - (long)pvStack_2a40);
    }
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)(local_2a60 + 8));
    TestKLPSystemSparse<double>((KLocalPolynomial<openjij::graph::Polynomial<double>_> *)local_29f0)
    ;
  }
  openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::~KLocalPolynomial
            ((KLocalPolynomial<openjij::graph::Polynomial<double>_> *)local_29f0);
  if (local_2a78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2a78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  std::
  _Hashtable<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_2860.poly_key_inv_._M_h);
  if (local_2860.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2860.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2860.poly_value_list_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2860.poly_value_list_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_2860.poly_key_list_);
  if (local_2860.sorted_variables_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2860.sorted_variables_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2860.sorted_variables_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2860.sorted_variables_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_long>,_std::allocator<std::pair<const_unsigned_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2860.variables_to_integers_._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2860.each_variable_num_._M_h);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_2860);
  return;
}

Assistant:

void TestKLPConstructorCimod(const cimod::Polynomial<IndexType, FloatType> &polynomial, std::string type) {
   cimod::BinaryPolynomialModel<IndexType, FloatType> bpm_cimod(polynomial, cimod::Vartype::BINARY);
   std::random_device rnd;
   std::mt19937 mt(rnd());
   openjij::graph::Binaries init_spins = openjij::graph::Polynomial<FloatType>(3).gen_binary(mt);
   
   auto system = openjij::system::make_k_local_polynomial(init_spins, bpm_cimod.ToSerializable());
   if (type == "Dense") {
      TestKLPSystemDense(system);
      system.reset_binaries(openjij::graph::Polynomial<FloatType>(3).gen_binary(mt));
      TestKLPSystemDense(system);
   }
   else if (type == "Sparse") {
      TestKLPSystemSparse(system);
      system.reset_binaries(openjij::graph::Polynomial<FloatType>(3).gen_binary(mt));
      TestKLPSystemSparse(system);
   }
   else {
      throw std::runtime_error("Unknown type");
   }
}